

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O0

SnapArrayInfo<void_*> *
TTD::NSSnapObjects::ExtractArrayValues<void*>(JavascriptArray *arrayObject,SlabAllocator *alloc)

{
  uint32 uVar1;
  BOOL BVar2;
  SnapArrayInfoBlock<void_*> *pSVar3;
  SnapArrayInfo<void_*> *pSVar4;
  uint32 local_50;
  uint32 local_4c;
  SnapArrayInfo<void_*> *res;
  uint32 endIdx_1;
  uint32 endIdx;
  uint32 idx;
  SnapArrayInfoBlock<void_*> *curr;
  uint32 i;
  uint32 length;
  SnapArrayInfoBlock<void_*> *sai;
  SlabAllocator *alloc_local;
  JavascriptArray *arrayObject_local;
  
  _i = (SnapArrayInfoBlock<void_*> *)0x0;
  uVar1 = Js::ArrayObject::GetLength(&arrayObject->super_ArrayObject);
  if (uVar1 != 0) {
    if (uVar1 < 0x101) {
      _i = AllocateArrayInfoBlock<void*,false>(alloc,0,uVar1);
      for (curr._0_4_ = 0; (uint)curr < uVar1; curr._0_4_ = (uint)curr + 1) {
        BVar2 = Js::JavascriptArray::DirectGetItemAt<void*>
                          (arrayObject,(uint)curr,_i->ArrayRangeContents + (uint)curr);
        _i->ArrayValidTags[(uint)curr] = (byte)BVar2;
      }
    }
    else {
      _endIdx = (SnapArrayInfoBlock<void_*> *)0x0;
      for (endIdx_1 = Js::JavascriptArray::GetNextIndex(arrayObject,0xffffffff);
          endIdx_1 != 0xffffffff; endIdx_1 = Js::JavascriptArray::GetNextIndex(arrayObject,endIdx_1)
          ) {
        if (_i == (SnapArrayInfoBlock<void_*> *)0x0) {
          if (endIdx_1 < 0xfffffe00) {
            local_4c = endIdx_1 + 0x200;
          }
          else {
            local_4c = 0xffffffff;
          }
          _endIdx = AllocateArrayInfoBlock<void*,true>(alloc,endIdx_1,local_4c);
          _i = _endIdx;
        }
        if (_endIdx == (SnapArrayInfoBlock<void_*> *)0x0) {
          TTDAbort_unrecoverable_error("Should get set with variable sai above when needed!");
        }
        if (_endIdx->LastIndex <= endIdx_1) {
          if (endIdx_1 < 0xfffffe00) {
            local_50 = endIdx_1 + 0x200;
          }
          else {
            local_50 = 0xffffffff;
          }
          pSVar3 = AllocateArrayInfoBlock<void*,true>(alloc,endIdx_1,local_50);
          _endIdx->Next = pSVar3;
          _endIdx = _endIdx->Next;
        }
        _endIdx->ArrayValidTags[endIdx_1 - _endIdx->FirstIndex] = '\x01';
        Js::JavascriptArray::DirectGetItemAt<void*>
                  (arrayObject,endIdx_1,
                   _endIdx->ArrayRangeContents + (endIdx_1 - _endIdx->FirstIndex));
      }
    }
  }
  pSVar4 = SlabAllocatorBase<0>::SlabAllocateStruct<TTD::NSSnapObjects::SnapArrayInfo<void*>>(alloc)
  ;
  uVar1 = Js::ArrayObject::GetLength(&arrayObject->super_ArrayObject);
  pSVar4->Length = uVar1;
  pSVar4->Data = _i;
  return pSVar4;
}

Assistant:

SnapArrayInfo<T>* ExtractArrayValues(Js::JavascriptArray* arrayObject, SlabAllocator& alloc)
        {
            SnapArrayInfoBlock<T>* sai = nullptr;

            uint32 length = arrayObject->GetLength();
            if(length == 0)
            {
                ; //just leave it as a null ptr
            }
            else if(length <= TTD_ARRAY_SMALL_ARRAY)
            {
                sai = AllocateArrayInfoBlock<T, false>(alloc, 0, length);
                for(uint32 i = 0; i < length; ++i)
                {
                    sai->ArrayValidTags[i] = (byte)arrayObject->DirectGetItemAt<T>(i, sai->ArrayRangeContents + i);
                }
            }
            else
            {
                SnapArrayInfoBlock<T>* curr = nullptr;
                for(uint32 idx = arrayObject->GetNextIndex(Js::JavascriptArray::InvalidIndex); idx != Js::JavascriptArray::InvalidIndex; idx = arrayObject->GetNextIndex(idx))
                {
                    if(sai == nullptr)
                    {
                        uint32 endIdx = (idx <= (Js::JavascriptArray::MaxArrayLength - TTD_ARRAY_BLOCK_SIZE)) ? (idx + TTD_ARRAY_BLOCK_SIZE) : Js::JavascriptArray::MaxArrayLength;
                        sai = AllocateArrayInfoBlock<T, true>(alloc, idx, endIdx);
                        curr = sai;
                    }

                    TTDAssert(curr != nullptr, "Should get set with variable sai above when needed!");
                    if(idx >= curr->LastIndex)
                    {
                        uint32 endIdx = (idx <= (Js::JavascriptArray::MaxArrayLength - TTD_ARRAY_BLOCK_SIZE)) ? (idx + TTD_ARRAY_BLOCK_SIZE) : Js::JavascriptArray::MaxArrayLength;
                        curr->Next = AllocateArrayInfoBlock<T, true>(alloc, idx, endIdx);
                        curr = curr->Next;
                    }

                    curr->ArrayValidTags[idx - curr->FirstIndex] = TRUE;
                    arrayObject->DirectGetItemAt<T>(idx, curr->ArrayRangeContents + (idx - curr->FirstIndex));
                }
            }

            SnapArrayInfo<T>* res = alloc.SlabAllocateStruct< SnapArrayInfo<T> >();
            res->Length = arrayObject->GetLength();
            res->Data = sai;

            return res;
        }